

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringVisitor.cpp
# Opt level: O0

bool __thiscall binlog::ToStringVisitor::visit(ToStringVisitor *this,SequenceBegin sb,Range *input)

{
  size_type sVar1;
  const_reference pcVar2;
  char *pcVar3;
  OstreamBuffer *__n;
  ToStringVisitor *in_RDI;
  char in_stack_ffffffffffffffcf;
  OstreamBuffer *in_stack_ffffffffffffffd0;
  OstreamBuffer *this_00;
  Range *this_01;
  
  this_01 = (Range *)&stack0x00000008;
  comma((ToStringVisitor *)in_stack_ffffffffffffffd0);
  sVar1 = mserialize::string_view::size((string_view *)&this_01->_end);
  if ((sVar1 == 1) &&
     (pcVar2 = mserialize::string_view::operator[]((string_view *)&this_01->_end,0), *pcVar2 == 'c')
     ) {
    __n = in_RDI->_out;
    this_00 = __n;
    pcVar3 = Range::view(this_01,(size_t)in_RDI);
    detail::OstreamBuffer::write(this_00,(int)pcVar3,this_01->_begin,(size_t)__n);
    return true;
  }
  detail::OstreamBuffer::put(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
  enterSeq(in_RDI);
  return false;
}

Assistant:

bool ToStringVisitor::visit(mserialize::Visitor::SequenceBegin sb, Range& input)
{
  comma();

  if (sb.tag.size() == 1 && sb.tag[0] == 'c') // skip char-by-char visitation of strings
  {
    _out.write(input.view(sb.size), sb.size);
    return true;
  }

  _out.put('[');
  enterSeq();

  return false;
}